

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_union_inplace(run_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  rle16_t *prVar6;
  uint uVar7;
  int min;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  rle16_t local_44;
  rle16_t *local_40;
  long local_38;
  
  _Var3 = run_container_is_full(src_1);
  _Var4 = run_container_is_full(src_2);
  if (_Var3 || _Var4) {
    if (_Var3) {
      return;
    }
    if (_Var4) {
      run_container_copy(src_2,src_1);
      return;
    }
  }
  iVar5 = src_1->n_runs;
  lVar10 = (long)src_2->n_runs + (long)iVar5;
  min = (int)lVar10 + iVar5;
  if (src_1->capacity < min) {
    run_container_grow(src_1,min,true);
    iVar5 = src_1->n_runs;
  }
  memmove(src_1->runs + lVar10,src_1->runs,(long)iVar5 << 2);
  local_38 = (long)src_1->n_runs;
  src_1->n_runs = 0;
  local_40 = src_1->runs + lVar10;
  uVar1 = local_40->value;
  uVar2 = src_2->runs->value;
  uVar7 = (uint)(uVar1 <= uVar2);
  uVar9 = (ulong)(uVar2 < uVar1);
  prVar6 = src_2->runs;
  if (uVar1 <= uVar2) {
    prVar6 = local_40;
  }
  local_44 = *prVar6;
  *src_1->runs = local_44;
  src_1->n_runs = src_1->n_runs + 1;
  while( true ) {
    iVar5 = src_2->n_runs;
    uVar8 = (ulong)uVar7;
    if ((iVar5 <= (int)uVar9) || ((int)local_38 <= (int)uVar7)) break;
    uVar1 = local_40[uVar8].value;
    uVar2 = src_2->runs[uVar9].value;
    prVar6 = local_40 + uVar8;
    if (uVar2 < uVar1) {
      prVar6 = src_2->runs + uVar9;
    }
    uVar9 = (ulong)((int)uVar9 + (uint)(uVar2 < uVar1));
    uVar7 = uVar7 + (uVar1 <= uVar2);
    run_container_append(src_1,*prVar6,&local_44);
  }
  for (; (long)uVar9 < (long)iVar5; uVar9 = uVar9 + 1) {
    run_container_append(src_1,src_2->runs[uVar9],&local_44);
    iVar5 = src_2->n_runs;
  }
  for (; (long)uVar8 < local_38; uVar8 = uVar8 + 1) {
    run_container_append(src_1,local_40[uVar8],&local_44);
  }
  return;
}

Assistant:

void run_container_union_inplace(run_container_t *src_1,
                                 const run_container_t *src_2) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return;
        }
        if (if2) {
            run_container_copy(src_2, src_1);
            return;
        }
    }
    // we move the data to the end of the current array
    const int32_t maxoutput = src_1->n_runs + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_1->n_runs;
    if (src_1->capacity < neededcapacity)
        run_container_grow(src_1, neededcapacity, true);
    memmove(src_1->runs + maxoutput, src_1->runs,
            src_1->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc1 = src_1->runs + maxoutput;
    const int32_t input1nruns = src_1->n_runs;
    src_1->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(src_1, inputsrc1[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(src_1, src_2->runs[xrlepos]);
        xrlepos++;
    }
    while ((xrlepos < src_2->n_runs) && (rlepos < input1nruns)) {
        rle16_t newrl;
        if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = inputsrc1[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(src_1, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(src_1, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < input1nruns) {
        run_container_append(src_1, inputsrc1[rlepos], &previousrle);
        rlepos++;
    }
}